

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_scalbn_mipsel(floatx80 a,int n,float_status *status)

{
  undefined1 auVar1 [12];
  uint64_t zSig0;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  floatx80 fVar6;
  floatx80 fVar7;
  
  uVar4 = a._8_8_;
  zSig0 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)zSig0)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mipsel(float_status *)");
    }
    uVar4 = CONCAT62(a._10_6_,0xffff);
    zSig0 = 0xc000000000000000;
    goto LAB_007d171e;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    uVar5 = 1;
    if (zSig0 == 0) goto LAB_007d171e;
LAB_007d16e6:
    iVar3 = -0x10000;
    if (-0x10000 < n) {
      iVar3 = n;
    }
    if (0xffff < iVar3) {
      iVar3 = 0x10000;
    }
    fVar6 = normalizeRoundAndPackFloatx80_mipsel
                      (status->floatx80_rounding_precision,a.high._1_1_ >> 7,iVar3 + uVar5,zSig0,0,
                       status);
    auVar1 = fVar6._0_12_;
  }
  else {
    uVar5 = (uint)uVar2;
    if (uVar2 != 0x7fff) goto LAB_007d16e6;
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
    goto LAB_007d171e;
    auVar1 = a._0_12_;
    fVar6._12_4_ = 0;
    fVar6.low = auVar1._0_8_;
    fVar6.high = auVar1._8_2_;
    fVar6._10_2_ = auVar1._10_2_;
    fVar6 = propagateFloatx80NaN_mipsel(a,fVar6,status);
    auVar1 = fVar6._0_12_;
  }
  zSig0 = auVar1._0_8_;
  uVar4 = (ulong)auVar1._8_4_;
LAB_007d171e:
  fVar7._8_8_ = uVar4 & 0xffffffff;
  fVar7.low = zSig0;
  return fVar7;
}

Assistant:

floatx80 floatx80_scalbn(floatx80 a, int n, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );

    if ( aExp == 0x7FFF ) {
        if ( aSig<<1 ) {
            return propagateFloatx80NaN(a, a, status);
        }
        return a;
    }

    if (aExp == 0) {
        if (aSig == 0) {
            return a;
        }
        aExp++;
    }

    if (n > 0x10000) {
        n = 0x10000;
    } else if (n < -0x10000) {
        n = -0x10000;
    }

    aExp += n;
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         aSign, aExp, aSig, 0, status);
}